

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O0

void __thiscall jpgd::jpeg_decoder::H2V1Convert(jpeg_decoder *this)

{
  int iVar1;
  uint8 uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  long in_RDI;
  int yy;
  int bc;
  int gc;
  int rc;
  int cr;
  int cb;
  int j;
  int l;
  int i;
  uint8 *c;
  uint8 *y;
  uint8 *d0;
  int row;
  int local_34;
  int local_30;
  int local_2c;
  byte *local_28;
  long local_20;
  uint8 *local_18;
  
  iVar4 = *(int *)(in_RDI + 0x248) - *(int *)(in_RDI + 0x288);
  local_18 = *(uint8 **)(in_RDI + 0x34b8);
  local_20 = *(long *)(in_RDI + 0x24a8) + (long)(iVar4 * 8);
  local_28 = (byte *)(*(long *)(in_RDI + 0x24a8) + 0x80 + (long)(iVar4 * 8));
  for (local_2c = *(int *)(in_RDI + 0x245c); 0 < local_2c; local_2c = local_2c + -1) {
    for (local_30 = 0; local_30 < 2; local_30 = local_30 + 1) {
      for (local_34 = 0; local_34 < 4; local_34 = local_34 + 1) {
        iVar4 = *(int *)(in_RDI + 0x24b8 + (long)(int)(uint)local_28[0x40] * 4);
        iVar5 = *(int *)(in_RDI + 0x2cb8 + (long)(int)(uint)local_28[0x40] * 4) +
                *(int *)(in_RDI + 0x30b8 + (long)(int)(uint)*local_28 * 4) >> 0x10;
        iVar1 = *(int *)(in_RDI + 0x28b8 + (long)(int)(uint)*local_28 * 4);
        uVar3 = (uint)*(byte *)(local_20 + (local_34 << 1));
        uVar2 = clamp(uVar3 + iVar4);
        *local_18 = uVar2;
        uVar2 = clamp(uVar3 + iVar5);
        local_18[1] = uVar2;
        uVar2 = clamp(uVar3 + iVar1);
        local_18[2] = uVar2;
        local_18[3] = 0xff;
        uVar3 = (uint)*(byte *)(local_20 + (local_34 * 2 + 1));
        uVar2 = clamp(uVar3 + iVar4);
        local_18[4] = uVar2;
        uVar2 = clamp(uVar3 + iVar5);
        local_18[5] = uVar2;
        uVar2 = clamp(uVar3 + iVar1);
        local_18[6] = uVar2;
        local_18[7] = 0xff;
        local_18 = local_18 + 8;
        local_28 = local_28 + 1;
      }
      local_20 = local_20 + 0x40;
    }
    local_20 = local_20 + 0x80;
    local_28 = local_28 + 0xf8;
  }
  return;
}

Assistant:

void jpeg_decoder::H2V1Convert()
	{
		int row = m_max_mcu_y_size - m_mcu_lines_left;
		uint8* d0 = m_pScan_line_0;
		uint8* y = m_pSample_buf + row * 8;
		uint8* c = m_pSample_buf + 2 * 64 + row * 8;

		for (int i = m_max_mcus_per_row; i > 0; i--)
		{
			for (int l = 0; l < 2; l++)
			{
				for (int j = 0; j < 4; j++)
				{
					int cb = c[0];
					int cr = c[64];

					int rc = m_crr[cr];
					int gc = ((m_crg[cr] + m_cbg[cb]) >> 16);
					int bc = m_cbb[cb];

					int yy = y[j << 1];
					d0[0] = clamp(yy + rc);
					d0[1] = clamp(yy + gc);
					d0[2] = clamp(yy + bc);
					d0[3] = 255;

					yy = y[(j << 1) + 1];
					d0[4] = clamp(yy + rc);
					d0[5] = clamp(yy + gc);
					d0[6] = clamp(yy + bc);
					d0[7] = 255;

					d0 += 8;

					c++;
				}
				y += 64;
			}

			y += 64 * 4 - 64 * 2;
			c += 64 * 4 - 8;
		}
	}